

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft2d.c
# Opt level: O0

void rfft2d(float *data,long M2,long M)

{
  long lVar1;
  xdouble *outdata;
  ulong uVar2;
  xdouble *indata;
  float *data_00;
  long Ncols;
  byte bVar3;
  long in_RDX;
  long in_RSI;
  long i1;
  ulong in_stack_ffffffffffffff70;
  long in_stack_ffffffffffffff78;
  float *in_stack_ffffffffffffff80;
  float *in_stack_ffffffffffffff88;
  long in_stack_ffffffffffffff90;
  float *in_stack_ffffffffffffff98;
  long in_stack_ffffffffffffffa0;
  xdouble *in_stack_ffffffffffffffa8;
  long in_stack_ffffffffffffffb0;
  xdouble *in_stack_ffffffffffffffb8;
  undefined8 local_20;
  byte bVar4;
  
  if ((in_RSI < 1) || (in_RDX < 1)) {
    rffts(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  }
  else {
    rffts(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    bVar3 = (byte)in_RDX;
    bVar4 = (byte)in_RSI;
    if (in_RDX == 1) {
      dxpose(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,(long)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      xpose(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
            (long)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      rffts(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      dxpose(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,(long)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    else if (in_RDX == 2) {
      lVar1 = 1L << (bVar4 & 0x3f);
      dxpose(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,lVar1,
             (long)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      outdata = (xdouble *)(1L << (bVar4 & 0x3f));
      xpose(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
            (long)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      rffts(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      uVar2 = (ulong)(1L << (bVar3 & 0x3f)) >> 1;
      dxpose(in_stack_ffffffffffffffb8,uVar2,outdata,lVar1,(long)in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90);
      indata = (xdouble *)(1L << (bVar4 & 0x3f));
      dxpose(indata,uVar2,outdata,lVar1,(long)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      ffts(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      dxpose(indata,uVar2,outdata,lVar1,(long)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    else {
      lVar1 = 1L << (bVar4 & 0x3f);
      dxpose(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,(long)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      data_00 = (float *)(1L << (bVar4 & 0x3f));
      xpose(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
            (long)data_00,lVar1,in_stack_ffffffffffffff70);
      rffts(data_00,lVar1,in_stack_ffffffffffffff70);
      dxpose(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,(long)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      Ncols = 1L << (bVar4 & 0x3f);
      dxpose(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,(long)in_stack_ffffffffffffff98,Ncols);
      ffts(data_00,lVar1,in_stack_ffffffffffffff70);
      uVar2 = (ulong)(1L << (bVar3 & 0x3f)) >> 1;
      dxpose(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,uVar2,Ncols);
      for (local_20 = 4; local_20 < (ulong)(1L << (bVar3 & 0x3f)) >> 1; local_20 = local_20 + 4) {
        dxpose(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0,uVar2,Ncols);
        ffts(data_00,lVar1,in_stack_ffffffffffffff70);
        in_stack_ffffffffffffff70 = (ulong)(1L << (bVar3 & 0x3f)) >> 1;
        dxpose(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0,uVar2,Ncols);
      }
    }
  }
  return;
}

Assistant:

void rfft2d(float *data, long M2, long M){
/* Compute 2D real fft and return results in-place	*/
/* First performs real fft on rows using size from M to compute positive frequencies */
/* then performs transform on columns using size from M2 to compute wavenumbers */
/* If you think of the result as a complex pow(2,M2) by pow(2,M-1) matrix */
/* then the first column contains the positive wavenumber spectra of DC frequency */
/* followed by the positive wavenumber spectra of the nyquest frequency */
/* since these are two positive wavenumber spectra the first complex value */
/* of each is really the real values for the zero and nyquest wavenumber packed together */
/* All other columns contain the positive and negative wavenumber spectra of a positive frequency */
/* See rspect2dprod for multiplying two of these spectra together- ex. for fast convolution */
/* INPUTS */
/* *data = input data array	*/
/* M2 = log2 of fft size number of rows in */
/* M = log2 of fft size number of columns in */
/* OUTPUTS */
/* *data = output data array	*/
long i1;
if((M2>0)&&(M>0)){
	rffts(data, M, POW2(M2));
	if (M==1){
		cxpose(data, POW2(M)/2, Array2d[M2]+POW2(M2)*2, POW2(M2), POW2(M2), 1);
		xpose(Array2d[M2]+POW2(M2)*2, 2, Array2d[M2], POW2(M2), POW2(M2), 2);
		rffts(Array2d[M2], M2, 2);
		cxpose(Array2d[M2], POW2(M2), data, POW2(M)/2, 1, POW2(M2));
	}
	else if (M==2){
		cxpose(data, POW2(M)/2, Array2d[M2]+POW2(M2)*2, POW2(M2), POW2(M2), 1);
		xpose(Array2d[M2]+POW2(M2)*2, 2, Array2d[M2], POW2(M2), POW2(M2), 2);
		rffts(Array2d[M2], M2, 2);
		cxpose(Array2d[M2], POW2(M2), data, POW2(M)/2, 1, POW2(M2));

		cxpose(data + 2, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 1);
		ffts(Array2d[M2], M2, 1);
		cxpose(Array2d[M2], POW2(M2), data + 2, POW2(M)/2, 1, POW2(M2));
	}
	else{
		cxpose(data, POW2(M)/2, Array2d[M2]+POW2(M2)*2, POW2(M2), POW2(M2), 1);
		xpose(Array2d[M2]+POW2(M2)*2, 2, Array2d[M2], POW2(M2), POW2(M2), 2);
		rffts(Array2d[M2], M2, 2);
		cxpose(Array2d[M2], POW2(M2), data, POW2(M)/2, 1, POW2(M2));

		cxpose(data + 2, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 3);
		ffts(Array2d[M2], M2, 3);
		cxpose(Array2d[M2], POW2(M2), data + 2, POW2(M)/2, 3, POW2(M2));
		for (i1=4; i1<POW2(M)/2; i1+=4){
			cxpose(data + i1*2, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 4);
			ffts(Array2d[M2], M2, 4);
			cxpose(Array2d[M2], POW2(M2), data + i1*2, POW2(M)/2, 4, POW2(M2));
		}
	}
}
else
	rffts(data, M2+M, 1);
}